

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::VertexArrayObjectTest::genReferences
          (VertexArrayObjectTest *this,Surface *vaoRef,Surface *defaultRef)

{
  VertexArrayState *pVVar1;
  RenderContext *pRVar2;
  GLenum GVar3;
  void *pvVar4;
  TextureFormat local_60;
  PixelBufferAccess local_58;
  
  pVVar1 = &(this->m_spec).vao;
  setState(this,pVVar1);
  glwUseProgram((this->m_vaoProgram->m_program).m_program);
  GVar3 = glwGetError();
  glu::checkError(GVar3,"glUseProgram(m_vaoProgram->getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                  ,0x270);
  makeDrawCall(this,pVVar1);
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_60.order = RGBA;
  local_60.type = UNORM_INT8;
  pvVar4 = (void *)(vaoRef->m_pixels).m_cap;
  if (pvVar4 != (void *)0x0) {
    pvVar4 = (vaoRef->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,&local_60,vaoRef->m_width,vaoRef->m_height,1,pvVar4);
  glu::readPixels(pRVar2,0,0,&local_58);
  pVVar1 = &(this->m_spec).state;
  setState(this,pVVar1);
  glwUseProgram((this->m_stateProgram->m_program).m_program);
  GVar3 = glwGetError();
  glu::checkError(GVar3,"glUseProgram(m_stateProgram->getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                  ,0x275);
  makeDrawCall(this,pVVar1);
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_60.order = RGBA;
  local_60.type = UNORM_INT8;
  pvVar4 = (void *)(defaultRef->m_pixels).m_cap;
  if (pvVar4 != (void *)0x0) {
    pvVar4 = (defaultRef->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,&local_60,defaultRef->m_width,defaultRef->m_height,1,pvVar4);
  glu::readPixels(pRVar2,0,0,&local_58);
  return;
}

Assistant:

void VertexArrayObjectTest::genReferences (tcu::Surface& vaoRef, tcu::Surface& defaultRef)
{
	setState(m_spec.vao);
	GLU_CHECK_CALL(glUseProgram(m_vaoProgram->getProgram()));
	makeDrawCall(m_spec.vao);
	glu::readPixels(m_context.getRenderContext(), 0, 0, vaoRef.getAccess());

	setState(m_spec.state);
	GLU_CHECK_CALL(glUseProgram(m_stateProgram->getProgram()));
	makeDrawCall(m_spec.state);
	glu::readPixels(m_context.getRenderContext(), 0, 0, defaultRef.getAccess());
}